

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginConfigurationParser.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b802::TestPluginConfigurationParser::~TestPluginConfigurationParser
          (TestPluginConfigurationParser *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

std::filesystem::path GetCorruptFile() {
            auto const corruptFile = std::filesystem::temp_directory_path() / "invalid.pb.txt";
            std::ofstream ofs(corruptFile, std::ofstream::trunc);
            if (!ofs.is_open())
            {
                throw std::runtime_error{ "Failed to open file " + corruptFile.native() + " for writing." };
            }
            ofs << invalidConfigStr;
            return corruptFile;
        }